

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_algorithm_deflate.c
# Opt level: O3

_Bool end(void *ud)

{
  zip_error_t *err;
  int iVar1;
  int ze;
  size_t ret;
  undefined8 *puVar2;
  
  if (*(char *)((long)ud + 8) == '\x01') {
    puVar2 = (undefined8 *)((long)ud + 0x20);
    ret = ZSTD_freeCStream(*(undefined8 *)((long)ud + 0x20));
  }
  else {
    puVar2 = (undefined8 *)((long)ud + 0x18);
    ret = ZSTD_freeDStream(*(undefined8 *)((long)ud + 0x18));
  }
  *puVar2 = 0;
  iVar1 = ZSTD_isError(ret);
  if (iVar1 != 0) {
    err = *ud;
    ze = map_error(ret);
    zip_error_set(err,ze,0);
  }
  return iVar1 == 0;
}

Assistant:

static bool
end(void *ud) {
    struct ctx *ctx = (struct ctx *)ud;
    int err;

    if (ctx->compress) {
        err = deflateEnd(&ctx->zstr);
    }
    else {
        err = inflateEnd(&ctx->zstr);
    }

    if (err != Z_OK) {
        zip_error_set(ctx->error, ZIP_ER_ZLIB, err);
        return false;
    }

    return true;
}